

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.cc
# Opt level: O3

void __thiscall cnn::ComputationGraph::ComputationGraph(ComputationGraph *this)

{
  int iVar1;
  ExecutionEngine *pEVar2;
  runtime_error *this_00;
  
  (this->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->parameter_nodes).
  super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->parameter_nodes).
  super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->parameter_nodes).
  super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->parameter_nodes).
  super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  pEVar2 = (ExecutionEngine *)operator_new(0x48);
  pEVar2->cg = this;
  pEVar2->_vptr_ExecutionEngine = (_func_int **)&PTR__SimpleExecutionEngine_0030d258;
  pEVar2[1]._vptr_ExecutionEngine = (_func_int **)0x0;
  pEVar2[1].cg = (ComputationGraph *)0x0;
  pEVar2[2]._vptr_ExecutionEngine = (_func_int **)0x0;
  pEVar2[2].cg = (ComputationGraph *)0x0;
  *(undefined8 *)((long)&pEVar2[2]._vptr_ExecutionEngine + 4) = 0;
  *(undefined8 *)((long)&pEVar2[2].cg + 4) = 0;
  *(undefined8 *)((long)&pEVar2[3]._vptr_ExecutionEngine + 4) = 0;
  *(undefined8 *)((long)&pEVar2[3].cg + 4) = 0;
  this->ee = pEVar2;
  iVar1 = n_hgs;
  n_hgs = n_hgs + 1;
  if (iVar1 < 1) {
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,
             "Memory allocator assumes only a single ComputationGraph at a time.\n",0x43);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Attempted to create >1 CG");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

ComputationGraph::ComputationGraph() :
  ee(new SimpleExecutionEngine(*this)) {
  ++n_hgs;
  if (n_hgs > 1) {
    cerr << "Memory allocator assumes only a single ComputationGraph at a time.\n";
    throw std::runtime_error("Attempted to create >1 CG");
  }
}